

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O1

void * rw::matfxClose(void *o,int32 param_2,int32 param_3)

{
  long lVar1;
  
  lVar1 = 1;
  do {
    if (*(ObjPipeline **)(&matFXGlobals + lVar1 * 2) == DAT_0014a268) {
      *(undefined8 *)(&matFXGlobals + lVar1 * 2) = 0;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xe);
  ObjPipeline::destroy(DAT_0014a268);
  DAT_0014a268 = (ObjPipeline *)0x0;
  return o;
}

Assistant:

static void*
matfxClose(void *o, int32, int32)
{
	for(uint i = 0; i < nelem(matFXGlobals.pipelines); i++)
		if(matFXGlobals.pipelines[i] == matFXGlobals.dummypipe)
			matFXGlobals.pipelines[i] = nil;
	matFXGlobals.dummypipe->destroy();
	matFXGlobals.dummypipe = nil;
	return o;
}